

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O0

void Saig_ManAnalizeControl(Aig_Man_t *p,int Reg)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar4;
  int local_3c;
  Aig_Obj_t *pAStack_38;
  int i;
  Aig_Obj_t *pAnd;
  Aig_Obj_t *pCtrl;
  Aig_Obj_t *pReg;
  Aig_Obj_t *pObj;
  int Reg_local;
  Aig_Man_t *p_local;
  
  pAVar2 = Saig_ManLo(p,Reg);
  iVar1 = Saig_ManRegNum(p);
  pAVar3 = Saig_ManLo(p,iVar1 + -1);
  if (pAVar2->Id < pAVar3->Id) {
    pAStack_38 = (Aig_Obj_t *)0x0;
    local_3c = 0;
    while ((iVar1 = Vec_PtrSize(p->vObjs), pObj_00 = pAStack_38, local_3c < iVar1 &&
           ((((pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_3c), pObj_00 == (Aig_Obj_t *)0x0
              || (iVar1 = Aig_ObjIsNode(pObj_00), iVar1 == 0)) ||
             (pAVar4 = Aig_ObjFanin0(pObj_00), pAVar4 != pAVar2)) ||
            (pAVar4 = Aig_ObjFanin1(pObj_00), pAVar4 != pAVar3))))) {
      local_3c = local_3c + 1;
    }
    pAStack_38 = pObj_00;
    if (pAStack_38 == (Aig_Obj_t *)0x0) {
      printf("Register is not found.\n");
    }
    else {
      printf("Clock-like register: \n");
      Aig_ObjPrint(p,pAVar2);
      printf("\n");
      printf("Control register: \n");
      Aig_ObjPrint(p,pAVar3);
      printf("\n");
      printf("Their fanout: \n");
      Aig_ObjPrint(p,pAStack_38);
      printf("\n");
      printf("Fanouts of the fanout: \n");
      for (local_3c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_3c < iVar1; local_3c = local_3c + 1) {
        pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_3c);
        if ((pAVar2 != (Aig_Obj_t *)0x0) &&
           ((pAVar3 = Aig_ObjFanin0(pAVar2), pAVar3 == pAStack_38 ||
            (pAVar3 = Aig_ObjFanin1(pAVar2), pAVar3 == pAStack_38)))) {
          Aig_ObjPrint(p,pAVar2);
          printf("\n");
        }
      }
      printf("\n");
    }
    return;
  }
  __assert_fail("pReg->Id < pCtrl->Id",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigPhase.c"
                ,0x26a,"void Saig_ManAnalizeControl(Aig_Man_t *, int)");
}

Assistant:

void Saig_ManAnalizeControl( Aig_Man_t * p, int Reg )
{
    Aig_Obj_t * pObj, * pReg, * pCtrl, * pAnd;
    int i;
    pReg = Saig_ManLo( p, Reg );
    pCtrl = Saig_ManLo( p, Saig_ManRegNum(p)-1 );
    assert( pReg->Id < pCtrl->Id );
    // find a node pointing to both
    pAnd = NULL;
    Aig_ManForEachNode( p, pObj, i )
    {
        if ( Aig_ObjFanin0(pObj) == pReg && Aig_ObjFanin1(pObj) == pCtrl )
        {
            pAnd = pObj;
            break;
        }
    }
    if ( pAnd == NULL )
    {
        printf( "Register is not found.\n" );
        return;
    }
    printf( "Clock-like register: \n" );
    Aig_ObjPrint( p, pReg );
    printf( "\n" );
    printf( "Control register: \n" );
    Aig_ObjPrint( p, pCtrl );
    printf( "\n" );
    printf( "Their fanout: \n" );
    Aig_ObjPrint( p, pAnd );
    printf( "\n" );
 
    // find the fanouts of pAnd
    printf( "Fanouts of the fanout: \n" );
    Aig_ManForEachObj( p, pObj, i )
        if ( Aig_ObjFanin0(pObj) == pAnd || Aig_ObjFanin1(pObj) == pAnd )
        {
            Aig_ObjPrint( p, pObj );
            printf( "\n" );
        }
    printf( "\n" );
}